

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:476:40),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<int> *pEVar1;
  Own<kj::(anonymous_namespace)::RefcountedInt> *in_00;
  int local_5d4;
  ExceptionOr<int> local_5d0;
  Own<kj::(anonymous_namespace)::RefcountedInt> *local_468;
  Own<kj::(anonymous_namespace)::RefcountedInt> *depValue;
  ExceptionOr<int> local_308;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.ptr = (RefcountedInt *)output;
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::ExceptionOr
            ((ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_468 = readMaybe<kj::(anonymous_namespace)::RefcountedInt>
                          ((Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_468 != (Own<kj::(anonymous_namespace)::RefcountedInt> *)0x0) {
      in_00 = mv<kj::Own<kj::(anonymous_namespace)::RefcountedInt>>(local_468);
      local_5d4 = MaybeVoidCaller<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,int>::
                  apply<kj::(anonymous_namespace)::TestCase466::run()::__1>
                            ((Type *)&this->field_0x20,in_00);
      handle(&local_5d0,this,&local_5d4);
      pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr.ptr);
      ExceptionOr<int>::operator=(pEVar1,&local_5d0);
      ExceptionOr<int>::~ExceptionOr(&local_5d0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_308,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr.ptr);
    ExceptionOr<int>::operator=(pEVar1,&local_308);
    ExceptionOr<int>::~ExceptionOr(&local_308);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~ExceptionOr
            ((ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }